

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingReader.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
  __i;
  __normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
  __i_00;
  __normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
  __first;
  move_iterator<__gnu_cxx::__normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>_>
  __first_00;
  const_iterator __position;
  const_iterator __position_00;
  bool bVar1;
  __type _Var2;
  Type TVar3;
  byte bVar4;
  TextMode TVar5;
  BarcodeFormat BVar6;
  int iVar7;
  Error *pEVar8;
  uchar *puVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  ostream *poVar10;
  size_type sVar11;
  ulong uVar12;
  char *pcVar13;
  int i;
  int blockSize;
  int N;
  type duration;
  time_point startTime;
  anon_class_1_0_00000001 printOptional;
  Result *barcode;
  iterator __end2;
  iterator __begin2;
  Barcodes *__range2;
  Barcodes merged;
  Barcodes barcodes;
  ImageView image;
  array<ZXing::ImageFormat,_5UL> ImageFormatFromChannels;
  unique_ptr<unsigned_char,_void_(*)(void_*)> buffer;
  int channels;
  int height;
  int width;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filePath;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int ret;
  Barcodes allBarcodes;
  CLI cli;
  ReaderOptions options;
  undefined4 in_stack_fffffffffffff728;
  enum_type in_stack_fffffffffffff72c;
  enum_type in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff734;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffff738;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
  in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff748;
  undefined1 in_stack_fffffffffffff74c;
  undefined1 in_stack_fffffffffffff74d;
  undefined1 in_stack_fffffffffffff74e;
  undefined1 in_stack_fffffffffffff74f;
  type in_stack_fffffffffffff750;
  type in_stack_fffffffffffff758;
  uint8_t *in_stack_fffffffffffff768;
  int in_stack_fffffffffffff770;
  int in_stack_fffffffffffff774;
  move_iterator<__gnu_cxx::__normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>_>
  in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff780;
  int in_stack_fffffffffffff784;
  int in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  ostream *in_stack_fffffffffffff790;
  ostream *in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7bc;
  ReaderOptions *in_stack_fffffffffffff7c0;
  char **in_stack_fffffffffffff7c8;
  int in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff818;
  BarcodeFormat in_stack_fffffffffffff81c;
  int local_5ac;
  duration<long,_std::ratio<1L,_1000L>_> local_568;
  int local_55c;
  duration<long,std::ratio<1l,1l>> local_558 [12];
  int local_54c;
  duration<long,std::ratio<1l,1000l>> local_548 [8];
  undefined8 local_540;
  rep local_538;
  ImageView local_530;
  int local_510;
  int local_50c;
  rep local_508;
  undefined8 local_500;
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  undefined1 local_478 [64];
  undefined1 local_438 [64];
  undefined1 local_3f8 [64];
  string local_3b8 [36];
  Int local_394;
  Int local_390;
  Flags<ZXing::BarcodeFormat> local_38c;
  undefined1 local_388 [64];
  string local_348 [40];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [56];
  string local_288 [32];
  string local_268 [32];
  undefined1 local_248 [64];
  string local_208 [32];
  Result *local_1e8;
  Result *local_1e0;
  __normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
  local_1d8;
  undefined1 *local_1d0;
  Result *local_1c8;
  Result *local_1c0;
  __normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
  local_1b8;
  Result *local_1b0;
  __normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
  local_1a8;
  Result *local_1a0;
  vector local_190 [24];
  Result *local_178;
  Result *local_170;
  Result *local_168;
  Result *local_160;
  ReaderOptions local_150 [2];
  undefined1 local_130 [24];
  ImageView local_118;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  code *local_e0;
  int local_c4;
  reference local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  int local_98;
  uint local_84;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68 [2];
  int local_30;
  byte local_28;
  byte local_27;
  ReaderOptions local_1c [2];
  uint local_4;
  
  local_4 = 0;
  ZXing::ReaderOptions::ReaderOptions((ReaderOptions *)0x114516);
  CLI::CLI((CLI *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::vector
            ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)0x114530);
  local_84 = 0;
  ZXing::ReaderOptions::setTextMode(local_1c,HRI);
  ZXing::ReaderOptions::setEanAddOnSymbol(local_1c,Read);
  bVar1 = ParseOptions(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0
                       ,(CLI *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  if (bVar1) {
    std::ios_base::setf((ios_base *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                        in_stack_fffffffffffff72c);
    local_a0 = local_68;
    local_a8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728)),
          bVar1) {
      local_b8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_a8);
      std::__cxx11::string::c_str();
      stbi_load((char *)in_stack_fffffffffffff758.__r,(int *)in_stack_fffffffffffff750.__r,
                (int *)CONCAT17(in_stack_fffffffffffff74f,
                                CONCAT16(in_stack_fffffffffffff74e,
                                         CONCAT15(in_stack_fffffffffffff74d,
                                                  CONCAT14(in_stack_fffffffffffff74c,
                                                           in_stack_fffffffffffff748)))),
                (int *)in_stack_fffffffffffff740.__r,(int)((ulong)in_stack_fffffffffffff738 >> 0x20)
               );
      local_e0 = stbi_image_free;
      std::unique_ptr<unsigned_char,void(*)(void*)>::unique_ptr<void(*)(void*),void>
                ((unique_ptr<unsigned_char,_void_(*)(void_*)> *)
                 CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                 (pointer)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                 (__enable_if_t<_is_lvalue_reference<void_(*)(void_*)>::value,_void_(*&&)(void_*)>)
                 0x1146d8);
      bVar1 = std::operator==((unique_ptr<unsigned_char,_void_(*)(void_*)> *)
                              CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                              (nullptr_t)
                              CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      if (bVar1) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Failed to read image: ");
        poVar10 = std::operator<<(poVar10,(string *)local_b8);
        poVar10 = std::operator<<(poVar10," (");
        pcVar13 = stbi_failure_reason();
        poVar10 = std::operator<<(poVar10,pcVar13);
        poVar10 = std::operator<<(poVar10,")");
        std::operator<<(poVar10,"\n");
        local_4 = 0xffffffff;
        local_98 = 1;
      }
      else {
        if (local_30 == 0) {
          local_5ac = local_c4;
        }
        else {
          local_5ac = local_30;
        }
        local_c4 = local_5ac;
        local_f8 = 0x100000000000000;
        uStack_f0 = 0x300010202000000;
        local_e8 = 0x4000102;
        std::unique_ptr<unsigned_char,_void_(*)(void_*)>::get
                  ((unique_ptr<unsigned_char,_void_(*)(void_*)> *)
                   CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
        std::array<ZXing::ImageFormat,_5UL>::at
                  ((array<ZXing::ImageFormat,_5UL> *)
                   CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                   CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
        in_stack_fffffffffffff728 = 0;
        ZXing::ImageView::ImageView
                  ((ImageView *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                   (uint8_t *)in_stack_fffffffffffff778._M_current._M_current,
                   in_stack_fffffffffffff774,in_stack_fffffffffffff770,
                   (ImageFormat)((ulong)in_stack_fffffffffffff768 >> 0x20),
                   (int)in_stack_fffffffffffff768,(int)in_stack_fffffffffffff790);
        ZXing::ImageView::rotated
                  ((ImageView *)in_stack_fffffffffffff750.__r,
                   CONCAT13(in_stack_fffffffffffff74f,
                            CONCAT12(in_stack_fffffffffffff74e,
                                     CONCAT11(in_stack_fffffffffffff74d,in_stack_fffffffffffff74c)))
                  );
        ZXing::ReadBarcodes((ImageView *)local_130,local_150);
        bVar1 = std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::empty
                          ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                           in_stack_fffffffffffff740.__r);
        if (bVar1) {
          std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::emplace_back<>
                    ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                     CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
        }
        local_160 = (Result *)
                    std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::end
                              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                               CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
        __gnu_cxx::
        __normal_iterator<ZXing::Result_const*,std::vector<ZXing::Result,std::allocator<ZXing::Result>>>
        ::__normal_iterator<ZXing::Result*>
                  ((__normal_iterator<const_ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
                    *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                   (__normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
                    *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
        local_168 = (Result *)
                    std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::begin
                              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                               CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
        local_170 = (Result *)
                    std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::end
                              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                               CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
        __position._M_current._4_4_ = in_stack_fffffffffffff78c;
        __position._M_current._0_4_ = in_stack_fffffffffffff788;
        __first._M_current._4_4_ = in_stack_fffffffffffff784;
        __first._M_current._0_4_ = in_stack_fffffffffffff780;
        local_178 = (Result *)
                    std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
                    insert<__gnu_cxx::__normal_iterator<ZXing::Result*,std::vector<ZXing::Result,std::allocator<ZXing::Result>>>,void>
                              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                               CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                               __position,__first,in_stack_fffffffffffff778._M_current);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff750.__r,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff74f,
                                          CONCAT16(in_stack_fffffffffffff74e,
                                                   CONCAT15(in_stack_fffffffffffff74d,
                                                            CONCAT14(in_stack_fffffffffffff74c,
                                                                     in_stack_fffffffffffff748)))));
        if (_Var2) {
          ZXing::MergeStructuredAppendSequences(local_190);
          local_1a0 = (Result *)
                      std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::end
                                ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                                 CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
          __gnu_cxx::
          __normal_iterator<ZXing::Result_const*,std::vector<ZXing::Result,std::allocator<ZXing::Result>>>
          ::__normal_iterator<ZXing::Result*>
                    ((__normal_iterator<const_ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
                      *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                     (__normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
                      *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
          local_1b0 = (Result *)
                      std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::begin
                                ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                                 CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
          __i._M_current._4_4_ = in_stack_fffffffffffff72c;
          __i._M_current._0_4_ = in_stack_fffffffffffff728;
          local_1a8._M_current =
               (Result *)
               std::
               make_move_iterator<__gnu_cxx::__normal_iterator<ZXing::Result*,std::vector<ZXing::Result,std::allocator<ZXing::Result>>>>
                         (__i);
          local_1c0 = (Result *)
                      std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::end
                                ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                                 CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
          __i_00._M_current._4_4_ = in_stack_fffffffffffff72c;
          __i_00._M_current._0_4_ = in_stack_fffffffffffff728;
          local_1b8._M_current =
               (Result *)
               std::
               make_move_iterator<__gnu_cxx::__normal_iterator<ZXing::Result*,std::vector<ZXing::Result,std::allocator<ZXing::Result>>>>
                         (__i_00);
          __position_00._M_current._4_4_ = in_stack_fffffffffffff78c;
          __position_00._M_current._0_4_ = in_stack_fffffffffffff788;
          __first_00._M_current._M_current._4_4_ = in_stack_fffffffffffff784;
          __first_00._M_current._M_current._0_4_ = in_stack_fffffffffffff780;
          local_1c8 = (Result *)
                      std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
                      insert<std::move_iterator<__gnu_cxx::__normal_iterator<ZXing::Result*,std::vector<ZXing::Result,std::allocator<ZXing::Result>>>>,void>
                                ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                                 CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                                 __position_00,__first_00,in_stack_fffffffffffff778);
          std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                    ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                     in_stack_fffffffffffff740.__r);
        }
        local_1d0 = local_130;
        local_1d8._M_current =
             (Result *)
             std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::begin
                       ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                        CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
        local_1e0 = (Result *)
                    std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::end
                              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                               CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                                  (__normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728)),
              bVar1) {
          local_1e8 = __gnu_cxx::
                      __normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
                      ::operator*(&local_1d8);
          uVar12 = std::__cxx11::string::empty();
          if ((uVar12 & 1) == 0) {
            ZXing::Result::position(local_1e8);
            pEVar8 = ZXing::Result::error(local_1e8);
            ZXing::Error::operator_cast_to_bool(pEVar8);
            drawRect((ImageView *)in_stack_fffffffffffff750.__r,
                     (Position *)
                     CONCAT17(in_stack_fffffffffffff74f,
                              CONCAT16(in_stack_fffffffffffff74e,
                                       CONCAT15(in_stack_fffffffffffff74d,
                                                CONCAT14(in_stack_fffffffffffff74c,
                                                         in_stack_fffffffffffff748)))),
                     SUB81((ulong)in_stack_fffffffffffff740.__r >> 0x38,0));
          }
          pEVar8 = ZXing::Result::error(local_1e8);
          TVar3 = ZXing::Error::type(pEVar8);
          local_84 = TVar3 | local_84;
          if ((local_27 & 1) == 0) {
            if ((local_28 & 1) == 0) {
              sVar11 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(local_68);
              if ((1 < sVar11) ||
                 (sVar11 = std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::size
                                     ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                                      local_130), 1 < sVar11)) {
                if ((main::firstFile & 1U) == 0) {
                  std::operator<<((ostream *)&std::cout,"\n");
                }
                sVar11 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(local_68);
                if (1 < sVar11) {
                  poVar10 = std::operator<<((ostream *)&std::cout,"File:       ");
                  poVar10 = std::operator<<(poVar10,(string *)local_b8);
                  std::operator<<(poVar10,"\n");
                }
                main::firstFile = false;
              }
              BVar6 = ZXing::Result::format(local_1e8);
              if (BVar6 == None) {
                std::operator<<((ostream *)&std::cout,"No barcode found\n");
              }
              else {
                poVar10 = std::operator<<((ostream *)&std::cout,"Text:       \"");
                ZXing::Result::text_abi_cxx11_();
                poVar10 = std::operator<<(poVar10,local_268);
                poVar10 = std::operator<<(poVar10,"\"\n");
                poVar10 = std::operator<<(poVar10,"Bytes:      ");
                TVar5 = ZXing::ReaderOptions::textMode(local_1c);
                if (TVar5 == ECI) {
                  ZXing::Result::bytesECI();
                }
                else {
                  ZXing::Result::bytes();
                  ZXing::ByteArray::ByteArray
                            ((ByteArray *)
                             CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                             (ByteArray *)
                             CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
                }
                ZXing::ToHex_abi_cxx11_((ByteArray *)in_stack_fffffffffffff798);
                poVar10 = std::operator<<(poVar10,local_288);
                poVar10 = std::operator<<(poVar10,"\n");
                poVar10 = std::operator<<(poVar10,"Format:     ");
                ZXing::Result::format(local_1e8);
                ZXing::ToString_abi_cxx11_((BarcodeFormat)local_2c0);
                poVar10 = std::operator<<(poVar10,local_2c0);
                poVar10 = std::operator<<(poVar10,"\n");
                poVar10 = std::operator<<(poVar10,"Identifier: ");
                ZXing::Result::symbologyIdentifier_abi_cxx11_();
                poVar10 = std::operator<<(poVar10,local_2e0);
                poVar10 = std::operator<<(poVar10,"\n");
                poVar10 = std::operator<<(poVar10,"Content:    ");
                ZXing::Result::contentType();
                ZXing::ToString_abi_cxx11_((ContentType)local_300);
                poVar10 = std::operator<<(poVar10,local_300);
                poVar10 = std::operator<<(poVar10,"\n");
                poVar10 = std::operator<<(poVar10,"HasECI:     ");
                bVar4 = ZXing::Result::hasECI();
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,(bool)(bVar4 & 1));
                poVar10 = std::operator<<(poVar10,"\n");
                poVar10 = std::operator<<(poVar10,"Position:   ");
                ZXing::Result::position(local_1e8);
                ZXing::ToString<int>
                          ((Quadrilateral<ZXing::PointT<int>_> *)
                           CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
                poVar10 = std::operator<<(poVar10,local_320);
                poVar10 = std::operator<<(poVar10,"\n");
                poVar10 = std::operator<<(poVar10,"Rotation:   ");
                iVar7 = ZXing::Result::orientation();
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
                poVar10 = std::operator<<(poVar10," deg\n");
                poVar10 = std::operator<<(poVar10,"IsMirrored: ");
                bVar1 = ZXing::Result::isMirrored(local_1e8);
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,bVar1);
                poVar10 = std::operator<<(poVar10,"\n");
                poVar10 = std::operator<<(poVar10,"IsInverted: ");
                bVar1 = ZXing::Result::isInverted(local_1e8);
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,bVar1);
                std::operator<<(poVar10,"\n");
                std::__cxx11::string::~string(local_320);
                std::__cxx11::string::~string(local_300);
                std::__cxx11::string::~string(local_2e0);
                std::__cxx11::string::~string(local_2c0);
                std::__cxx11::string::~string(local_288);
                ZXing::ByteArray::~ByteArray((ByteArray *)0x115573);
                std::__cxx11::string::~string(local_268);
                ZXing::Result::ecLevel_abi_cxx11_();
                main::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)
                           CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                           (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                           (string *)0x1155b3);
                std::__cxx11::string::~string(local_348);
                ZXing::Result::version_abi_cxx11_();
                main::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)
                           CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                           (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                           (string *)0x1155f5);
                std::__cxx11::string::~string((string *)(local_388 + 0x20));
                ZXing::Result::error(local_1e8);
                ZXing::ToString_abi_cxx11_((Error *)local_388);
                main::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)
                           CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                           (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                           (string *)0x11564e);
                std::__cxx11::string::~string((string *)local_388);
                iVar7 = ZXing::Result::lineCount(local_1e8);
                if (iVar7 != 0) {
                  poVar10 = std::operator<<((ostream *)&std::cout,"Lines:      ");
                  iVar7 = ZXing::Result::lineCount(local_1e8);
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
                  std::operator<<(poVar10,"\n");
                }
                local_394 = (Int)ZXing::operator|(in_stack_fffffffffffff730,
                                                  in_stack_fffffffffffff72c);
                local_390 = (Int)ZXing::Flags<ZXing::BarcodeFormat>::operator|
                                           ((Flags<ZXing::BarcodeFormat> *)
                                            CONCAT44(in_stack_fffffffffffff72c,
                                                     in_stack_fffffffffffff728),None);
                local_38c = ZXing::Flags<ZXing::BarcodeFormat>::operator|
                                      ((Flags<ZXing::BarcodeFormat> *)
                                       CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728)
                                       ,None);
                BVar6 = ZXing::Result::format(local_1e8);
                bVar1 = ZXing::Flags<ZXing::BarcodeFormat>::testFlag(&local_38c,BVar6);
                if (bVar1) {
                  ZXing::Result::text_abi_cxx11_();
                  ZXing::Result::format(local_1e8);
                  ZXing::GTIN::LookupCountryIdentifier(local_3b8,(int)local_3f8 + DataBar);
                  main::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)
                             CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                             (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                             (string *)0x115944);
                  std::__cxx11::string::~string(local_3b8);
                  std::__cxx11::string::~string((string *)(local_3f8 + 0x20));
                  ZXing::GTIN::EanAddOn_abi_cxx11_((Result *)local_3f8);
                  main::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)
                             CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                             (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                             (string *)0x115993);
                  std::__cxx11::string::~string((string *)local_3f8);
                  ZXing::GTIN::EanAddOn_abi_cxx11_((Result *)local_438);
                  ZXing::GTIN::Price((string *)(local_438 + 0x20));
                  main::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)
                             CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                             (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                             (string *)0x1159ec);
                  std::__cxx11::string::~string((string *)(local_438 + 0x20));
                  std::__cxx11::string::~string((string *)local_438);
                  ZXing::GTIN::EanAddOn_abi_cxx11_((Result *)local_478);
                  ZXing::GTIN::IssueNr((string *)(local_478 + 0x20));
                  main::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)
                             CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                             (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                             (string *)0x115a52);
                  std::__cxx11::string::~string((string *)(local_478 + 0x20));
                  std::__cxx11::string::~string((string *)local_478);
                }
                else {
                  in_stack_fffffffffffff81c = ZXing::Result::format(local_1e8);
                  if (in_stack_fffffffffffff81c == ITF) {
                    ZXing::Result::bytes();
                    iVar7 = ZXing::Size<ZXing::ByteArray>
                                      ((ByteArray *)
                                       CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730)
                                      );
                    if (iVar7 == 0xe) {
                      ZXing::Result::text_abi_cxx11_();
                      ZXing::Result::format(local_1e8);
                      ZXing::GTIN::LookupCountryIdentifier(local_498,(BarcodeFormat)local_4b8);
                      main::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)
                                 CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                                 (char *)CONCAT44(in_stack_fffffffffffff72c,
                                                  in_stack_fffffffffffff728),(string *)0x115c40);
                      std::__cxx11::string::~string(local_498);
                      std::__cxx11::string::~string(local_4b8);
                    }
                  }
                }
                bVar1 = ZXing::Result::isPartOfSequence
                                  ((Result *)
                                   CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
                if (bVar1) {
                  poVar10 = std::operator<<((ostream *)&std::cout,"Structured Append: symbol ");
                  iVar7 = ZXing::Result::sequenceIndex();
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7 + 1);
                  poVar10 = std::operator<<(poVar10," of ");
                  iVar7 = ZXing::Result::sequenceSize();
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
                  poVar10 = std::operator<<(poVar10," (parity/id: \'");
                  ZXing::Result::sequenceId_abi_cxx11_();
                  poVar10 = std::operator<<(poVar10,local_4d8);
                  std::operator<<(poVar10,"\')\n");
                  std::__cxx11::string::~string(local_4d8);
                }
                else {
                  iVar7 = ZXing::Result::sequenceSize();
                  if (0 < iVar7) {
                    poVar10 = std::operator<<((ostream *)&std::cout,
                                              "Structured Append: merged result from ");
                    iVar7 = ZXing::Result::sequenceSize();
                    poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
                    in_stack_fffffffffffff798 = std::operator<<(poVar10," symbols (parity/id: \'");
                    ZXing::Result::sequenceId_abi_cxx11_();
                    in_stack_fffffffffffff790 = std::operator<<(in_stack_fffffffffffff798,local_4f8)
                    ;
                    std::operator<<(in_stack_fffffffffffff790,"\')\n");
                    std::__cxx11::string::~string(local_4f8);
                  }
                }
                bVar1 = ZXing::Result::readerInit(local_1e8);
                in_stack_fffffffffffff78c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff78c);
                if (bVar1) {
                  std::operator<<((ostream *)&std::cout,"Reader Initialisation/Programming\n");
                }
              }
            }
            else {
              poVar10 = std::operator<<((ostream *)&std::cout,(string *)local_b8);
              poVar10 = std::operator<<(poVar10," ");
              ZXing::Result::format(local_1e8);
              ZXing::ToString_abi_cxx11_((BarcodeFormat)local_208);
              std::operator<<(poVar10,local_208);
              std::__cxx11::string::~string(local_208);
              bVar4 = ZXing::Result::isValid();
              if ((bVar4 & 1) == 0) {
                pEVar8 = ZXing::Result::error(local_1e8);
                bVar1 = ZXing::Error::operator_cast_to_bool(pEVar8);
                if (bVar1) {
                  poVar10 = std::operator<<((ostream *)&std::cout," ");
                  ZXing::Result::error(local_1e8);
                  ZXing::ToString_abi_cxx11_((Error *)local_248);
                  std::operator<<(poVar10,(string *)local_248);
                  std::__cxx11::string::~string((string *)local_248);
                }
              }
              else {
                poVar10 = std::operator<<((ostream *)&std::cout," \"");
                ZXing::Result::text_abi_cxx11_((char)local_248 + 0x20);
                poVar10 = std::operator<<(poVar10,(string *)(local_248 + 0x20));
                std::operator<<(poVar10,"\"");
                std::__cxx11::string::~string((string *)(local_248 + 0x20));
              }
              std::operator<<((ostream *)&std::cout,"\n");
            }
          }
          else {
            ZXing::Result::bytes();
            puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x114c6b);
            this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ZXing::Result::bytes();
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this);
            std::ostream::write((char *)&std::cout,(long)puVar9);
          }
          __gnu_cxx::
          __normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
          ::operator++(&local_1d8);
        }
        in_stack_fffffffffffff788 =
             ZXing::Size<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
        if ((in_stack_fffffffffffff788 == 1) &&
           (uVar12 = std::__cxx11::string::empty(), (uVar12 & 1) == 0)) {
          in_stack_fffffffffffff778._M_current._M_current =
               (__normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
                )std::__cxx11::string::c_str();
          in_stack_fffffffffffff784 = ZXing::ImageView::width((ImageView *)(local_130 + 0x18));
          in_stack_fffffffffffff774 = ZXing::ImageView::height((ImageView *)(local_130 + 0x18));
          in_stack_fffffffffffff768 = ZXing::ImageView::data((ImageView *)(local_130 + 0x18));
          ZXing::ImageView::rowStride((ImageView *)(local_130 + 0x18));
          stbi_write_png((char *)in_stack_fffffffffffff758.__r,
                         (int)((ulong)in_stack_fffffffffffff750.__r >> 0x20),
                         (int)in_stack_fffffffffffff750.__r,
                         CONCAT13(in_stack_fffffffffffff74f,
                                  CONCAT12(in_stack_fffffffffffff74e,
                                           CONCAT11(in_stack_fffffffffffff74d,
                                                    in_stack_fffffffffffff74c))),
                         (void *)in_stack_fffffffffffff740.__r,
                         (int)((ulong)in_stack_fffffffffffff738 >> 0x20));
        }
        pcVar13 = getenv("MEASURE_PERF");
        if (pcVar13 != (char *)0x0) {
          local_500 = std::chrono::_V2::system_clock::now();
          in_stack_fffffffffffff758 =
               std::chrono::operator-
                         (in_stack_fffffffffffff738,
                          (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
          local_50c = 0;
          local_510 = 1;
          local_508 = in_stack_fffffffffffff758.__r;
          do {
            for (local_530._28_4_ = 0; (int)local_530._28_4_ < local_510;
                local_530._28_4_ = local_530._28_4_ + 1) {
              ZXing::ReadBarcodes(&local_530,(ReaderOptions *)(local_130 + 0x18));
              std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                        ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                         in_stack_fffffffffffff740.__r);
            }
            local_50c = local_50c + local_510;
            local_540 = std::chrono::_V2::system_clock::now();
            in_stack_fffffffffffff750 =
                 std::chrono::operator-
                           (in_stack_fffffffffffff738,
                            (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
            in_stack_fffffffffffff74f = false;
            local_538 = in_stack_fffffffffffff750.__r;
            local_508 = in_stack_fffffffffffff750.__r;
            if (local_510 < 1000) {
              local_54c = 100;
              std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                        (local_548,&local_54c);
              in_stack_fffffffffffff74e =
                   std::chrono::operator<
                             ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                              in_stack_fffffffffffff740.__r,
                              (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff738);
              in_stack_fffffffffffff74f = in_stack_fffffffffffff74e;
            }
            if ((bool)in_stack_fffffffffffff74f != false) {
              local_510 = local_510 * 10;
            }
            local_55c = 1;
            std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_558,&local_55c);
            in_stack_fffffffffffff74d =
                 std::chrono::operator<
                           ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                            in_stack_fffffffffffff740.__r,
                            (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff738);
          } while ((bool)in_stack_fffffffffffff74d);
          in_stack_fffffffffffff740 =
               std::chrono::
               duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                         ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                          CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
          local_568.__r = in_stack_fffffffffffff740.__r;
          in_stack_fffffffffffff738 =
               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_568);
          printf("time: %5.2f ms per frame\n",
                 SUB84((double)(long)in_stack_fffffffffffff738 / (double)local_50c,0));
        }
        std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                  ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                   in_stack_fffffffffffff740.__r);
        local_98 = 0;
      }
      std::unique_ptr<unsigned_char,_void_(*)(void_*)>::~unique_ptr
                ((unique_ptr<unsigned_char,_void_(*)(void_*)> *)in_stack_fffffffffffff740.__r);
      if (local_98 != 0) goto LAB_001162ce;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_a8);
    }
    local_4 = local_84;
    local_98 = 1;
  }
  else {
    PrintUsage((char *)in_stack_fffffffffffff790);
    local_4 = 0xffffffff;
    local_98 = 1;
  }
LAB_001162ce:
  std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
            ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)in_stack_fffffffffffff740.__r)
  ;
  CLI::~CLI((CLI *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
	ReaderOptions options;
	CLI cli;
	Barcodes allBarcodes;
	int ret = 0;

	options.setTextMode(TextMode::HRI);
	options.setEanAddOnSymbol(EanAddOnSymbol::Read);

	if (!ParseOptions(argc, argv, options, cli)) {
		PrintUsage(argv[0]);
		return -1;
	}

	std::cout.setf(std::ios::boolalpha);

	for (const auto& filePath : cli.filePaths) {
		int width, height, channels;
		std::unique_ptr<stbi_uc, void (*)(void*)> buffer(stbi_load(filePath.c_str(), &width, &height, &channels, cli.forceChannels),
														 stbi_image_free);
		if (buffer == nullptr) {
			std::cerr << "Failed to read image: " << filePath << " (" << stbi_failure_reason() << ")" << "\n";
			return -1;
		}
		channels = cli.forceChannels ? cli.forceChannels : channels;

		auto ImageFormatFromChannels = std::array{ImageFormat::None, ImageFormat::Lum, ImageFormat::LumA, ImageFormat::RGB, ImageFormat::RGBA};
		ImageView image{buffer.get(), width, height, ImageFormatFromChannels.at(channels)};
		auto barcodes = ReadBarcodes(image.rotated(cli.rotate), options);

		// if we did not find anything, insert a dummy to produce some output for each file
		if (barcodes.empty())
			barcodes.emplace_back();

		allBarcodes.insert(allBarcodes.end(), barcodes.begin(), barcodes.end());
		if (filePath == cli.filePaths.back()) {
			auto merged = MergeStructuredAppendSequences(allBarcodes);
			// report all merged sequences as part of the last file to make the logic not overly complicated here
			barcodes.insert(barcodes.end(), std::make_move_iterator(merged.begin()), std::make_move_iterator(merged.end()));
		}

		for (auto&& barcode : barcodes) {

			if (!cli.outPath.empty())
				drawRect(image, barcode.position(), bool(barcode.error()));

			ret |= static_cast<int>(barcode.error().type());

			if (cli.bytesOnly) {
				std::cout.write(reinterpret_cast<const char*>(barcode.bytes().data()), barcode.bytes().size());
				continue;
			}

			if (cli.oneLine) {
				std::cout << filePath << " " << ToString(barcode.format());
				if (barcode.isValid())
					std::cout << " \"" << barcode.text(TextMode::Escaped) << "\"";
				else if (barcode.error())
					std::cout << " " << ToString(barcode.error());
				std::cout << "\n";
				continue;
			}

			if (cli.filePaths.size() > 1 || barcodes.size() > 1) {
				static bool firstFile = true;
				if (!firstFile)
					std::cout << "\n";
				if (cli.filePaths.size() > 1)
					std::cout << "File:       " << filePath << "\n";
				firstFile = false;
			}

			if (barcode.format() == BarcodeFormat::None) {
				std::cout << "No barcode found\n";
				continue;
			}

			std::cout << "Text:       \"" << barcode.text() << "\"\n"
					  << "Bytes:      " << ToHex(options.textMode() == TextMode::ECI ? barcode.bytesECI() : barcode.bytes()) << "\n"
					  << "Format:     " << ToString(barcode.format()) << "\n"
					  << "Identifier: " << barcode.symbologyIdentifier() << "\n"
					  << "Content:    " << ToString(barcode.contentType()) << "\n"
					  << "HasECI:     " << barcode.hasECI() << "\n"
					  << "Position:   " << ToString(barcode.position()) << "\n"
					  << "Rotation:   " << barcode.orientation() << " deg\n"
					  << "IsMirrored: " << barcode.isMirrored() << "\n"
					  << "IsInverted: " << barcode.isInverted() << "\n";

			auto printOptional = [](const char* key, const std::string& v) {
				if (!v.empty())
					std::cout << key << v << "\n";
			};

			printOptional("EC Level:   ", barcode.ecLevel());
			printOptional("Version:    ", barcode.version());
			printOptional("Error:      ", ToString(barcode.error()));

			if (barcode.lineCount())
				std::cout << "Lines:      " << barcode.lineCount() << "\n";

			if ((BarcodeFormat::EAN13 | BarcodeFormat::EAN8 | BarcodeFormat::UPCA | BarcodeFormat::UPCE)
					.testFlag(barcode.format())) {
				printOptional("Country:    ", GTIN::LookupCountryIdentifier(barcode.text(), barcode.format()));
				printOptional("Add-On:     ", GTIN::EanAddOn(barcode));
				printOptional("Price:      ", GTIN::Price(GTIN::EanAddOn(barcode)));
				printOptional("Issue #:    ", GTIN::IssueNr(GTIN::EanAddOn(barcode)));
			} else if (barcode.format() == BarcodeFormat::ITF && Size(barcode.bytes()) == 14) {
				printOptional("Country:    ", GTIN::LookupCountryIdentifier(barcode.text(), barcode.format()));
			}

			if (barcode.isPartOfSequence())
				std::cout << "Structured Append: symbol " << barcode.sequenceIndex() + 1 << " of "
						  << barcode.sequenceSize() << " (parity/id: '" << barcode.sequenceId() << "')\n";
			else if (barcode.sequenceSize() > 0)
				std::cout << "Structured Append: merged result from " << barcode.sequenceSize() << " symbols (parity/id: '"
						  << barcode.sequenceId() << "')\n";

			if (barcode.readerInit())
				std::cout << "Reader Initialisation/Programming\n";

#ifdef ZXING_EXPERIMENTAL_API
			if (cli.showSymbol && barcode.symbol().data())
				std::cout << "Symbol:\n" << WriteBarcodeToUtf8(barcode);
#endif
		}

		if (Size(cli.filePaths) == 1 && !cli.outPath.empty())
			stbi_write_png(cli.outPath.c_str(), image.width(), image.height(), 3, image.data(), image.rowStride());

#ifdef NDEBUG
		if (getenv("MEASURE_PERF")) {
			auto startTime = std::chrono::high_resolution_clock::now();
			auto duration = startTime - startTime;
			int N = 0;
			int blockSize = 1;
			do {
				for (int i = 0; i < blockSize; ++i)
					ReadBarcodes(image, options);
				N += blockSize;
				duration = std::chrono::high_resolution_clock::now() - startTime;
				if (blockSize < 1000 && duration < std::chrono::milliseconds(100))
					blockSize *= 10;
			} while (duration < std::chrono::seconds(1));
			printf("time: %5.2f ms per frame\n", double(std::chrono::duration_cast<std::chrono::milliseconds>(duration).count()) / N);
		}
#endif
	}

	return ret;
}